

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

Track * __thiscall ASDCP::MXF::Track::WriteToTLVSet(Track *this,TLVWriter *TLVSet)

{
  int iVar1;
  MDDEntry *Object;
  MDDEntry *pMVar2;
  MDDEntry *in_RDX;
  TLVWriter local_108;
  TLVWriter local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVWriter *TLVSet_local;
  Track *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOWriter.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x38b,"virtual ASDCP::Result_t ASDCP::MXF::Track::WriteToTLVSet(TLVWriter &)");
  }
  local_21 = 0;
  local_20 = in_RDX;
  GenericTrack::WriteToTLVSet(&this->super_GenericTrack,TLVSet);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar2 = local_20;
  if (-1 < iVar1) {
    Object = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,MDD_Track_EditRate);
    TLVWriter::WriteObject(&local_a0,pMVar2,(IArchive *)Object);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,MDD_Track_Origin);
    TLVWriter::WriteUi64(&local_108,local_20,(ui64_t *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  return this;
}

Assistant:

ASDCP::Result_t
Track::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = GenericTrack::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(Track, EditRate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi64(OBJ_WRITE_ARGS(Track, Origin));
  return result;
}